

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpplocate.cpp
# Opt level: O0

cpplocate * __thiscall cpplocate::localDir(cpplocate *this,string *application)

{
  uint applicationLength;
  char *application_00;
  uint local_24;
  char *pcStack_20;
  uint length;
  char *dir;
  string *application_local;
  
  pcStack_20 = (char *)0x0;
  local_24 = 0;
  dir = (char *)application;
  application_local = (string *)this;
  application_00 = (char *)std::__cxx11::string::c_str();
  applicationLength = std::__cxx11::string::size();
  ::localDir(&stack0xffffffffffffffe0,&local_24,application_00,applicationLength);
  (anonymous_namespace)::obtainStringFromLibLocate_abi_cxx11_
            ((_anonymous_namespace_ *)this,pcStack_20,local_24);
  return this;
}

Assistant:

std::string localDir(const std::string & application)
{
    char * dir = nullptr;
    unsigned int length = 0;

    ::localDir(&dir, &length, application.c_str(), (unsigned int)application.size());

    // Convert to string and free memory from liblocate
    return obtainStringFromLibLocate(dir, length);
}